

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O3

int Gia_ObjLevelId(Gia_Man_t *p,int Id)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  
  iVar2 = *(int *)((long)&p->pName + 4);
  if (Id < iVar2) goto LAB_007c396d;
  iVar4 = Id + 1;
  iVar1 = *(int *)&p->pName;
  if (Id < iVar1 * 2) {
    if (iVar1 <= Id) {
      if (p->pSpec == (char *)0x0) {
        pcVar3 = (char *)malloc((long)iVar1 << 3);
      }
      else {
        pcVar3 = (char *)realloc(p->pSpec,(long)iVar1 << 3);
      }
      p->pSpec = pcVar3;
      iVar2 = iVar1 * 2;
LAB_007c393d:
      if (pcVar3 == (char *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      *(int *)&p->pName = iVar2;
      iVar2 = *(int *)((long)&p->pName + 4);
    }
  }
  else if (iVar1 <= Id) {
    if (p->pSpec == (char *)0x0) {
      pcVar3 = (char *)malloc((long)iVar4 << 2);
    }
    else {
      pcVar3 = (char *)realloc(p->pSpec,(long)iVar4 << 2);
    }
    p->pSpec = pcVar3;
    iVar2 = iVar4;
    goto LAB_007c393d;
  }
  if (iVar2 <= Id) {
    memset(p->pSpec + (long)iVar2 * 4,0,(ulong)(uint)(Id - iVar2) * 4 + 4);
  }
  *(int *)((long)&p->pName + 4) = iVar4;
  iVar2 = iVar4;
LAB_007c396d:
  if ((-1 < Id) && (Id < iVar2)) {
    return *(int *)(p->pSpec + (ulong)(uint)Id * 4);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int          Gia_ObjLevelId( Gia_Man_t * p, int Id )             { return Vec_IntGetEntry(p->vLevels, Id);                    }